

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ReadWriteMemTask::checkArguments
          (ReadWriteMemTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  bool bVar3;
  Type *this_00;
  Diagnostic *this_01;
  Type *pTVar4;
  Expression *arg;
  Type *unaff_RBP;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,2,4);
  if (!bVar2) {
    return pCVar1->errorType;
  }
  bVar2 = Type::canBeStringLike(((*args->_M_ptr)->type).ptr);
  if (bVar2) {
    bVar2 = Type::isUnpackedArray((args->_M_ptr[1]->type).ptr);
    arg = args->_M_ptr[1];
    if (bVar2) {
      pTVar4 = (arg->type).ptr;
      do {
        if (pTVar4->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar4);
        }
        if ((pTVar4->canonical->super_Symbol).kind == AssociativeArrayType) {
          this_00 = Type::getAssociativeIndexType(pTVar4);
          bVar2 = true;
          if ((this_00 != (Type *)0x0) && (bVar3 = Type::isIntegral(this_00), !bVar3)) {
            this_01 = ASTContext::addDiag(context,(DiagCode)0x1f000b,args->_M_ptr[1]->sourceRange);
            Diagnostic::operator<<
                      (this_01,&(this->super_SystemTaskBase).super_SystemSubroutine.name);
            unaff_RBP = pCVar1->errorType;
            bVar2 = false;
          }
          if (!bVar2) {
            return unaff_RBP;
          }
        }
        pTVar4 = Type::getArrayElementType(pTVar4);
        bVar2 = Type::isUnpackedArray(pTVar4);
      } while (bVar2);
      bVar2 = Type::isIntegral(pTVar4);
      if (bVar2) {
        if ((args->_M_extent)._M_extent_value < 3) {
LAB_0040e5fa:
          return pCVar1->voidType;
        }
        bVar2 = Type::isNumeric((args->_M_ptr[2]->type).ptr);
        if (bVar2) {
          if (((args->_M_extent)._M_extent_value != 4) ||
             (bVar2 = Type::isNumeric((args->_M_ptr[3]->type).ptr), bVar2)) goto LAB_0040e5fa;
          arg = args->_M_ptr[3];
        }
        else {
          arg = args->_M_ptr[2];
        }
      }
      else {
        arg = args->_M_ptr[1];
      }
    }
  }
  else {
    arg = *args->_M_ptr;
  }
  pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 4))
            return comp.getErrorType();

        if (!args[0]->type->canBeStringLike())
            return badArg(context, *args[0]);

        if (!args[1]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        const Type* t = args[1]->type;
        do {
            if (t->isAssociativeArray()) {
                auto indexType = t->getAssociativeIndexType();
                if (indexType && !indexType->isIntegral()) {
                    context.addDiag(diag::QueryOnAssociativeNonIntegral, args[1]->sourceRange)
                        << name;
                    return comp.getErrorType();
                }
            }
            t = t->getArrayElementType();
        } while (t->isUnpackedArray());

        if (!t->isIntegral())
            return badArg(context, *args[1]);

        if (args.size() >= 3) {
            if (!args[2]->type->isNumeric())
                return badArg(context, *args[2]);

            if (args.size() == 4) {
                if (!args[3]->type->isNumeric())
                    return badArg(context, *args[3]);
            }
        }

        return comp.getVoidType();
    }